

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O2

void __thiscall cmDynamicLoaderCache::FlushCache(cmDynamicLoaderCache *this)

{
  cmDynamicLoaderCache *pcVar1;
  _Self __tmp;
  _Base_ptr p_Var2;
  
  for (p_Var2 = (this->CacheMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pcVar1 = Instance,
      (_Rb_tree_header *)p_Var2 != &(this->CacheMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    cmsys::DynamicLoader::CloseLibrary(*(LibraryHandle *)(p_Var2 + 2));
  }
  if (Instance != (cmDynamicLoaderCache *)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                 *)Instance);
  }
  operator_delete(pcVar1,0x30);
  Instance = (cmDynamicLoaderCache *)0x0;
  return;
}

Assistant:

void cmDynamicLoaderCache::FlushCache()
{
  for (std::map<std::string, cmsys::DynamicLoader::LibraryHandle>::iterator
         it = this->CacheMap.begin();
       it != this->CacheMap.end(); it++) {
    cmsys::DynamicLoader::CloseLibrary(it->second);
  }
  delete cmDynamicLoaderCache::Instance;
  cmDynamicLoaderCache::Instance = CM_NULLPTR;
}